

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeightedSnapshot.cc
# Opt level: O0

void __thiscall cppmetrics::WeightedSnapshot::~WeightedSnapshot(WeightedSnapshot *this)

{
  WeightedSnapshot *this_local;
  
  (this->super_Snapshot)._vptr_Snapshot = (_func_int **)&PTR__WeightedSnapshot_00190ba8;
  std::
  vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
  ::~vector(&this->m_elements);
  Snapshot::~Snapshot(&this->super_Snapshot);
  return;
}

Assistant:

double WeightedSnapshot::get_value(double quantile) const
{
  if (quantile < 0 || quantile > 1.0 || std::isnan(quantile))
  {
    throw std::domain_error{"Quantile must be between 0.0 and 1.0"};
  }

  if (size() == 0)
  {
    return 0.0;
  }

  auto lb = std::lower_bound(
    std::begin(m_elements), std::end(m_elements), quantile,
    [](const Element& element, const double& q) { return element.quantile < q; }
  );

  if (lb == std::begin(m_elements))
  {
    // All values are of a greater quantile than requested; just return
    // the least.
    return get_min();
  }

  if (lb == std::end(m_elements))
  {
    // All values have a smaller quantile than requested; return the max.
    return get_max();
  }

  // At this point lb is pointed to the first element *not less than* the request
  // quantile.  Back up one and return its value.
  if (!HasEquivalentOrder(quantile, lb->quantile))
  {
    --lb;
  }

  return lb->value;
}